

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_t max;
  char *pcVar5;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  uint uVar12;
  byte *__s2;
  curl_slist *pcVar13;
  CURLcode CVar14;
  bool bVar15;
  bool bVar16;
  char *local_40;
  curl_slist *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
  do {
    pcVar10 = conn_to_host->data;
    local_38 = conn_to_host;
    if (*pcVar10 == ':') {
      pcVar10 = pcVar10 + 1;
      bVar15 = true;
LAB_00456530:
      if (bVar15) {
        if (*pcVar10 != ':') {
          pcVar5 = strchr(pcVar10,0x3a);
          if (pcVar5 != (char *)0x0) {
            local_40 = (char *)0x0;
            lVar6 = strtol(pcVar10,&local_40,10);
            if (local_40 == pcVar5) {
              bVar16 = lVar6 == conn->remote_port;
              if (bVar16) {
                pcVar10 = pcVar5 + 1;
              }
              goto LAB_00456582;
            }
          }
          goto LAB_00456580;
        }
        bVar16 = true;
        pcVar10 = pcVar10 + 1;
      }
      else {
LAB_00456580:
        bVar16 = false;
      }
LAB_00456582:
      pcVar13 = local_38;
      bVar3 = true;
      uVar12 = 0xffffffff;
      if (!bVar15) {
        CVar14 = CURLE_OK;
        bVar3 = true;
        goto LAB_0045669f;
      }
      if ((bVar16) && (*pcVar10 != '\0')) {
        pbVar7 = (byte *)(*Curl_cstrdup)(pcVar10);
        if (pbVar7 == (byte *)0x0) {
          CVar14 = CURLE_OUT_OF_MEMORY;
          pcVar10 = (char *)0x0;
          bVar3 = false;
        }
        else {
          pbVar11 = pbVar7;
          __s2 = pbVar7;
          if (*pbVar7 == 0x5b) {
            bVar2 = pbVar7[1];
            pbVar11 = pbVar7 + 1;
            for (__s2 = pbVar11;
                (bVar2 != 0 &&
                (((iVar4 = Curl_isxdigit((uint)bVar2), iVar4 != 0 || (*__s2 == 0x3a)) ||
                 (*__s2 == 0x2e)))); __s2 = __s2 + 1) {
              bVar2 = __s2[1];
            }
            if (*__s2 == 0x25) {
              iVar4 = strncmp("%25",(char *)__s2,3);
              if (iVar4 != 0) {
                Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
              }
              do {
                pbVar1 = __s2 + 1;
                __s2 = __s2 + 1;
                if (*pbVar1 == 0) break;
                iVar4 = Curl_isalpha((uint)*pbVar1);
              } while (((iVar4 != 0) || (iVar4 = Curl_isxdigit((uint)*__s2), iVar4 != 0)) ||
                      ((bVar2 = *__s2, bVar2 - 0x2d < 2 || ((bVar2 == 0x7e || (bVar2 == 0x5f))))));
            }
            if (*__s2 == 0x5d) {
              *__s2 = 0;
              __s2 = __s2 + 1;
            }
            else {
              Curl_infof(data,"Invalid IPv6 address format\n");
            }
          }
          pcVar10 = strchr((char *)__s2,0x3a);
          if (pcVar10 == (char *)0x0) {
            uVar12 = 0xffffffff;
          }
          else {
            local_40 = (char *)0x0;
            *pcVar10 = '\0';
            uVar12 = 0xffffffff;
            if (pcVar10[1] != '\0') {
              uVar8 = strtol(pcVar10 + 1,&local_40,10);
              if (((local_40 == (char *)0x0) || (*local_40 == '\0')) && (uVar8 < 0x10000)) {
                uVar12 = (uint)uVar8;
              }
              else {
                Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar10 + 1)
                ;
                pbVar11 = (byte *)0x0;
              }
            }
          }
          bVar3 = true;
          if (pbVar11 == (byte *)0x0) {
            pcVar10 = (char *)0x0;
            CVar14 = CURLE_OK;
          }
          else {
            pcVar10 = (*Curl_cstrdup)((char *)pbVar11);
            CVar14 = CURLE_OK;
            if (pcVar10 == (char *)0x0) {
              CVar14 = CURLE_OUT_OF_MEMORY;
              uVar12 = 0xffffffff;
              bVar3 = false;
            }
          }
          (*Curl_cfree)(pbVar7);
        }
      }
      else {
        pcVar10 = (char *)0x0;
        CVar14 = CURLE_OK;
      }
    }
    else {
      bVar15 = (conn->bits).ipv6_ip != false;
      pcVar5 = "";
      if (bVar15) {
        pcVar5 = "[";
      }
      pcVar9 = "";
      if (bVar15) {
        pcVar9 = "]";
      }
      bVar15 = false;
      pcVar5 = curl_maprintf("%s%s%s",pcVar5,(conn->host).name,pcVar9);
      if (pcVar5 != (char *)0x0) {
        max = strlen(pcVar5);
        iVar4 = Curl_strncasecompare(pcVar10,pcVar5,max);
        (*Curl_cfree)(pcVar5);
        bVar15 = false;
        if (iVar4 != 0) {
          bVar15 = pcVar10[max] == ':';
        }
        pcVar10 = pcVar10 + max + 1;
      }
      if (pcVar5 != (char *)0x0) goto LAB_00456530;
      CVar14 = CURLE_OUT_OF_MEMORY;
      bVar3 = false;
LAB_0045669f:
      pcVar10 = (char *)0x0;
      uVar12 = 0xffffffff;
      pcVar13 = local_38;
    }
    if (!bVar3) {
      return CVar14;
    }
    if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
      (conn->bits).conn_to_host = false;
      (*Curl_cfree)(pcVar10);
      bVar15 = true;
    }
    else {
      (conn->conn_to_host).rawalloc = pcVar10;
      (conn->conn_to_host).name = pcVar10;
      (conn->bits).conn_to_host = true;
      bVar15 = false;
      Curl_infof(data,"Connecting to hostname: %s\n",pcVar10);
    }
    if ((int)uVar12 < 0) {
      (conn->bits).conn_to_port = false;
    }
    else {
      conn->conn_to_port = uVar12;
      (conn->bits).conn_to_port = true;
      Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar12);
    }
    conn_to_host = pcVar13->next;
    if (!bVar15 || conn_to_host == (curl_slist *)0x0) {
      return CURLE_OK;
    }
    if (-1 < (int)uVar12) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}